

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::setSelectionArea
          (QGraphicsScene *this,QPainterPath *path,ItemSelectionOperation selectionOperation,
          ItemSelectionMode mode,QTransform *deviceTransform)

{
  int *piVar1;
  long lVar2;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *this_00;
  Span *pSVar3;
  long lVar4;
  bool bVar5;
  GraphicsItemFlags GVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  size_t local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QPainterPath::operator=((QPainterPath *)(lVar2 + 0x118),path);
  local_40.d = *(Data **)(lVar2 + 0x128);
  if ((local_40.d != (Data *)0x0) &&
     (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(int *)(lVar2 + 0x120) = *(int *)(lVar2 + 0x120) + 1;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x80))
            (&local_58,*(long **)(*(long *)(this + 8) + 0x88),path,mode,1,deviceTransform);
  lVar4 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
  lVar8 = local_58.size << 3;
  bVar9 = false;
  for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 8) {
    this_00 = *(Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> **)(lVar4 + lVar10);
    item = (QGraphicsItem *)this_00;
    GVar6 = QGraphicsItem::flags((QGraphicsItem *)this_00);
    if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
               super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 2) != 0) {
      bVar5 = QGraphicsItem::isSelected(item);
      bVar9 = (bool)(bVar9 | !bVar5);
      QHash<QGraphicsItem*,QHashDummyValue>::removeImpl<QGraphicsItem*>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_40,&item);
      QGraphicsItem::setSelected(item,true);
    }
  }
  if (selectionOperation == ReplaceSelection) {
    _item = (piter)QHash<QGraphicsItem_*,_QHashDummyValue>::begin(&local_40);
    while( true ) {
      if (item == (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)0x0 &&
          item._8_8_ == 0) break;
      pSVar3 = item->spans;
      uVar7 = item._8_8_ >> 7;
      QGraphicsItem::setSelected
                (*(QGraphicsItem **)
                  pSVar3[uVar7].entries[pSVar3[uVar7].offsets[item._8_4_ & 0x7f]].storage.data,false
                );
      QHashPrivate::iterator<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)&item);
      bVar9 = true;
    }
  }
  piVar1 = (int *)(lVar2 + 0x120);
  *piVar1 = *piVar1 + -1;
  if ((*piVar1 == 0) && (bVar9)) {
    selectionChanged(this);
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setSelectionArea(const QPainterPath &path,
                                      Qt::ItemSelectionOperation selectionOperation,
                                      Qt::ItemSelectionMode mode,
                                      const QTransform &deviceTransform)
{
    Q_D(QGraphicsScene);

    // Note: with boolean path operations, we can improve performance here
    // quite a lot by "growing" the old path instead of replacing it. That
    // allows us to only check the intersect area for changes, instead of
    // reevaluating the whole path over again.
    d->selectionArea = path;

    QSet<QGraphicsItem *> unselectItems = d->selectedItems;

    // Disable emitting selectionChanged() for individual items.
    ++d->selectionChanging;
    bool changed = false;

    // Set all items in path to selected.
    const auto items = this->items(path, mode, Qt::DescendingOrder, deviceTransform);
    for (QGraphicsItem *item : items) {
        if (item->flags() & QGraphicsItem::ItemIsSelectable) {
            if (!item->isSelected())
                changed = true;
            unselectItems.remove(item);
            item->setSelected(true);
        }
    }

    switch (selectionOperation) {
    case Qt::ReplaceSelection:
        // Deselect all items outside path.
        for (QGraphicsItem *item : std::as_const(unselectItems)) {
            item->setSelected(false);
            changed = true;
        }
        break;
    default:
        break;
    }

    // Re-enable emitting selectionChanged() for individual items.
    --d->selectionChanging;

    if (!d->selectionChanging && changed)
        emit selectionChanged();
}